

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

bool duckdb::Date::TryFromDate(int32_t year,int32_t month,int32_t day,date_t *result)

{
  bool bVar1;
  int iVar2;
  undefined1 *puVar3;
  uint uVar4;
  
  bVar1 = IsValid(year,month,day);
  if (bVar1) {
    if (((year & 3U) != 0) ||
       ((puVar3 = CUMULATIVE_LEAP_DAYS,
        (year * -0x3d70a3d7 + 0x51eb850U >> 2 | year * 0x40000000) < 0x28f5c29 &&
        (year != (year / 400) * 400)))) {
      puVar3 = CUMULATIVE_DAYS;
    }
    iVar2 = *(int *)(puVar3 + (long)month * 4 + -4) + day + -1;
    if (year < 0x7b2) {
      uVar4 = (0x7b2U - year) / 400;
      iVar2 = uVar4 * -0x23ab1 + iVar2 +
              *(int *)(CUMULATIVE_YEAR_DAYS + ((uVar4 * 400 - (0x7b2U - year)) * 4 + 0x640)) +
              -0x23ab1;
    }
    else if (year < 0x942) {
      iVar2 = iVar2 + *(int *)(CUMULATIVE_YEAR_DAYS + (ulong)(year - 0x7b2) * 4);
    }
    else {
      iVar2 = ((year - 0x942U) / 400) * 0x23ab1 + iVar2 +
              *(int *)(CUMULATIVE_YEAR_DAYS + (ulong)((year - 0x942U) % 400) * 4) + 0x23ab1;
    }
    result->days = iVar2;
  }
  return bVar1;
}

Assistant:

bool Date::TryFromDate(int32_t year, int32_t month, int32_t day, date_t &result) {
	int32_t n = 0;
	if (!Date::IsValid(year, month, day)) {
		return false;
	}
	n += Date::IsLeapYear(year) ? Date::CUMULATIVE_LEAP_DAYS[month - 1] : Date::CUMULATIVE_DAYS[month - 1];
	n += day - 1;
	if (year < 1970) {
		int32_t diff_from_base = 1970 - year;
		int32_t year_index = 400 - (diff_from_base % 400);
		int32_t fractions = diff_from_base / 400;
		n += Date::CUMULATIVE_YEAR_DAYS[year_index];
		n -= Date::DAYS_PER_YEAR_INTERVAL;
		n -= fractions * Date::DAYS_PER_YEAR_INTERVAL;
	} else if (year >= 2370) {
		int32_t diff_from_base = year - 2370;
		int32_t year_index = diff_from_base % 400;
		int32_t fractions = diff_from_base / 400;
		n += Date::CUMULATIVE_YEAR_DAYS[year_index];
		n += Date::DAYS_PER_YEAR_INTERVAL;
		n += fractions * Date::DAYS_PER_YEAR_INTERVAL;
	} else {
		n += Date::CUMULATIVE_YEAR_DAYS[year - 1970];
	}
#ifdef DEBUG
	int32_t y, m, d;
	Date::Convert(date_t(n), y, m, d);
	D_ASSERT(year == y);
	D_ASSERT(month == m);
	D_ASSERT(day == d);
#endif
	result = date_t(n);
	return true;
}